

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

bool __thiscall internalJSONNode::IsEqualTo(internalJSONNode *this,internalJSONNode *val)

{
  JSONNode *pJVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  json_index_t jVar5;
  json_index_t jVar6;
  JSONNode **ppJVar7;
  JSONNode **ppJVar8;
  json_string *pjVar9;
  JSONNode **ppJVar10;
  double dVar11;
  allocator local_59;
  JSONNode **local_58;
  json_string local_50;
  
  if (this == val) {
    return true;
  }
  if ((this->_type == val->_type) && (bVar2 = std::operator!=(&this->_name,&val->_name), !bVar2)) {
    if (this->_type == '\0') {
      return true;
    }
    Fetch(this);
    Fetch(val);
    switch(this->_type) {
    case '\x01':
      _Var3 = std::operator==(&val->_string,&this->_string);
      return _Var3;
    case '\x02':
      dVar11 = (val->_value)._number - (this->_value)._number;
      if ((this->_value)._number < (val->_value)._number) {
        return dVar11 < 1e-05;
      }
      return -1e-05 < dVar11;
    case '\x03':
      return (val->_value)._bool == (this->_value)._bool;
    case '\x04':
    case '\x05':
      bVar2 = true;
      break;
    default:
      bVar2 = false;
    }
    std::__cxx11::string::string
              ((string *)&local_50,"Checking for equality, not sure what type",&local_59);
    JSONDebug::_JSON_ASSERT(bVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    jVar5 = jsonChildren::size(this->Children);
    jVar6 = jsonChildren::size(val->Children);
    if (jVar5 == jVar6) {
      ppJVar7 = jsonChildren::begin(val->Children);
      ppJVar8 = jsonChildren::begin(this->Children);
      local_58 = jsonChildren::end(this->Children);
      while( true ) {
        bVar2 = ppJVar8 == local_58;
        if (bVar2) {
          return bVar2;
        }
        pJVar1 = *ppJVar8;
        pjVar9 = jsonSingletonERROR_NULL_IN_CHILDREN::getValue_abi_cxx11_();
        JSONDebug::_JSON_ASSERT(pJVar1 != (JSONNode *)0x0,pjVar9);
        pJVar1 = *ppJVar7;
        pjVar9 = jsonSingletonERROR_NULL_IN_CHILDREN::getValue_abi_cxx11_();
        JSONDebug::_JSON_ASSERT(pJVar1 != (JSONNode *)0x0,pjVar9);
        ppJVar10 = jsonChildren::end(val->Children);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "at the end of other one\'s children, but they\'re the same size?",&local_59);
        JSONDebug::_JSON_ASSERT(ppJVar7 != ppJVar10,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = ::JSONNode::operator!=(*ppJVar8,*ppJVar7);
        if (bVar4) break;
        ppJVar7 = ppJVar7 + 1;
        ppJVar8 = ppJVar8 + 1;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool internalJSONNode::IsEqualTo(const internalJSONNode * val) const json_nothrow {
    if (this == val) return true;  //same internal object, so they must be equal (not only for ref counting)
    if (type() != val -> type()) return false;	 //aren't even same type
    if (_name != val -> _name) return false;  //names aren't the same
    if (type() == JSON_NULL) return true;  //both null, can't be different
    #if !defined(JSON_PREPARSE) && defined(JSON_READ_PRIORITY) 
	   Fetch();
	   val -> Fetch();
    #endif 
    switch (type()){
	   case JSON_STRING:
		  return val -> _string == _string;
	   case JSON_NUMBER:
		  return _floatsAreEqual(val -> _value._number, _value._number);
	   case JSON_BOOL:
		  return val -> _value._bool == _value._bool;
    };

    JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Checking for equality, not sure what type"));
    if (CHILDREN -> size() != val -> CHILDREN -> size()) return false;  //if they arne't he same size then they certainly aren't equal

    //make sure each children is the same
    JSONNode ** valrunner = val -> CHILDREN -> begin();
    json_foreach(CHILDREN, myrunner){
        JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(*valrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(valrunner != val -> CHILDREN -> end(), JSON_TEXT("at the end of other one's children, but they're the same size?"));
        if (**myrunner != **valrunner) return false;
		++valrunner;
    }
    return true;
}